

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_nanohttp(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int test_ret;
  
  if (quiet == 0) {
    printf("Testing nanohttp : 13 of 17 functions ...\n");
  }
  iVar1 = test_xmlNanoHTTPAuthHeader();
  iVar2 = test_xmlNanoHTTPCleanup();
  iVar3 = test_xmlNanoHTTPContentLength();
  iVar4 = test_xmlNanoHTTPEncoding();
  iVar5 = test_xmlNanoHTTPFetch();
  iVar6 = test_xmlNanoHTTPInit();
  iVar7 = test_xmlNanoHTTPMimeType();
  iVar8 = test_xmlNanoHTTPOpen();
  iVar9 = test_xmlNanoHTTPOpenRedir();
  iVar10 = test_xmlNanoHTTPRead();
  iVar11 = test_xmlNanoHTTPRedir();
  iVar12 = test_xmlNanoHTTPReturnCode();
  iVar13 = test_xmlNanoHTTPSave();
  iVar14 = test_xmlNanoHTTPScanProxy();
  uVar15 = iVar14 + iVar13 + iVar12 + iVar11 + iVar10 + iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + 
                                                  iVar4 + iVar3 + iVar2 + iVar1;
  if (uVar15 != 0) {
    printf("Module nanohttp: %d errors\n",(ulong)uVar15);
  }
  return uVar15;
}

Assistant:

static int
test_nanohttp(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing nanohttp : 13 of 17 functions ...\n");
    test_ret += test_xmlNanoHTTPAuthHeader();
    test_ret += test_xmlNanoHTTPCleanup();
    test_ret += test_xmlNanoHTTPContentLength();
    test_ret += test_xmlNanoHTTPEncoding();
    test_ret += test_xmlNanoHTTPFetch();
    test_ret += test_xmlNanoHTTPInit();
    test_ret += test_xmlNanoHTTPMimeType();
    test_ret += test_xmlNanoHTTPOpen();
    test_ret += test_xmlNanoHTTPOpenRedir();
    test_ret += test_xmlNanoHTTPRead();
    test_ret += test_xmlNanoHTTPRedir();
    test_ret += test_xmlNanoHTTPReturnCode();
    test_ret += test_xmlNanoHTTPSave();
    test_ret += test_xmlNanoHTTPScanProxy();

    if (test_ret != 0)
	printf("Module nanohttp: %d errors\n", test_ret);
    return(test_ret);
}